

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O0

void __thiscall
wasm::CoalesceLocalsWithLearning::pickIndices
          (CoalesceLocalsWithLearning *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  size_t *generator_00;
  bool bVar1;
  bool bVar2;
  Function *pFVar3;
  size_t sVar4;
  uint *puVar5;
  Order *pOVar6;
  double dVar7;
  double newBest;
  double local_2778;
  double oldBest;
  GeneticLearner<Order,_double,_Generator> learner;
  Generator generator;
  uint local_28;
  uint local_24;
  int iStack_20;
  int GENERATION_SIZE;
  size_t numVars;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices_local;
  CoalesceLocalsWithLearning *this_local;
  
  numVars = (size_t)indices;
  indices_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  pFVar3 = Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::getFunction
                     ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)
                      &(this->super_CoalesceLocals).
                       super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                       .
                       super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     );
  sVar4 = Function::getNumVars(pFVar3);
  if (sVar4 < 2) {
    CoalesceLocals::pickIndices
              (&this->super_CoalesceLocals,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)numVars);
  }
  else {
    pFVar3 = Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::getFunction
                       ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)
                        &(this->super_CoalesceLocals).
                         super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                         .
                         super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                       );
    _iStack_20 = Function::getNumVars(pFVar3);
    local_28 = iStack_20 * (iStack_20 + -1);
    generator._5012_4_ = 0x14;
    puVar5 = std::min<unsigned_int>(&local_28,(uint *)&generator.field_0x1394);
    local_24 = *puVar5;
    generator_00 = &learner.noise._M_p;
    pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator::Generator(wasm
    ::CoalesceLocalsWithLearning__(generator_00,this);
    GeneticLearner<Order,_double,_Generator>::GeneticLearner
              ((GeneticLearner<Order,_double,_Generator> *)&oldBest,(Generator *)generator_00,
               (long)(int)local_24);
    pOVar6 = GeneticLearner<Order,_double,_Generator>::getBest
                       ((GeneticLearner<Order,_double,_Generator> *)&oldBest);
    local_2778 = pickIndices::Order::getFitness(pOVar6);
    do {
      do {
        GeneticLearner<Order,_double,_Generator>::runGeneration
                  ((GeneticLearner<Order,_double,_Generator> *)&oldBest);
        pOVar6 = GeneticLearner<Order,_double,_Generator>::getBest
                           ((GeneticLearner<Order,_double,_Generator> *)&oldBest);
        dVar7 = pickIndices::Order::getFitness(pOVar6);
        bVar1 = NAN(local_2778);
        bVar2 = dVar7 != local_2778;
        local_2778 = dVar7;
      } while (bVar2);
    } while (NAN(dVar7) || bVar1);
    pOVar6 = GeneticLearner<Order,_double,_Generator>::getBest
                       ((GeneticLearner<Order,_double,_Generator> *)&oldBest);
    CoalesceLocals::pickIndicesFromOrder
              (&this->super_CoalesceLocals,
               &pOVar6->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)numVars);
    GeneticLearner<Order,_double,_Generator>::~GeneticLearner
              ((GeneticLearner<Order,_double,_Generator> *)&oldBest);
  }
  return;
}

Assistant:

void CoalesceLocalsWithLearning::pickIndices(std::vector<Index>& indices) {
  if (getFunction()->getNumVars() <= 1) {
    // nothing to think about here
    CoalesceLocals::pickIndices(indices);
    return;
  }

  struct Order : public std::vector<Index> {
    void setFitness(double f) { fitness = f; }
    double getFitness() { return fitness; }
    void dump(std::string text) {
      std::cout << text + ": ( ";
      for (Index i = 0; i < size(); i++) {
        std::cout << (*this)[i] << " ";
      }
      std::cout << ")\n";
      std::cout << "of quality: " << getFitness() << "\n";
    }

  private:
    double fitness;
  };

  struct Generator {
    Generator(CoalesceLocalsWithLearning* parent) : parent(parent), noise(42) {}

    void calculateFitness(Order* order) {
      // apply the order
      std::vector<Index> indices; // the phenotype
      Index removedCopies;
      parent->pickIndicesFromOrder(*order, indices, removedCopies);
      auto maxIndex = *std::max_element(indices.begin(), indices.end());
      assert(maxIndex <= parent->numLocals);
      // main part of fitness is the number of locals
      double fitness = parent->numLocals - maxIndex; // higher fitness is better
      // secondarily, it is nice to not reorder locals unnecessarily
      double fragment = 1.0 / (2.0 * parent->numLocals);
      for (Index i = 0; i < parent->numLocals; i++) {
        if ((*order)[i] == i) {
          fitness += fragment; // boost for each that wasn't moved
        }
      }
      // removing copies is a secondary concern
      fitness = (100 * fitness) + removedCopies;
      order->setFitness(fitness);
    }

    Order* makeRandom() {
      auto* ret = new Order;
      ret->resize(parent->numLocals);
      for (Index i = 0; i < parent->numLocals; i++) {
        (*ret)[i] = i;
      }
      if (first) {
        // as the first guess, use the natural order. this is not arbitrary for
        // two reasons. first, there may be an inherent order in the input
        // (frequent indices are lower, etc.). second, by ensuring we start with
        // the natural order, we ensure we are at least as good as the
        // non-learning variant.
        // TODO: use ::pickIndices from the parent, so we literally get the
        //       simpler approach as our first option
        first = false;
      } else {
        // leave params alone, shuffle the rest
        std::shuffle(ret->begin() + parent->getFunction()->getNumParams(),
                     ret->end(),
                     noise);
      }
      calculateFitness(ret);
#ifdef CFG_LEARN_DEBUG
      order->dump("new rando");
#endif
      return ret;
    }

    Order* makeMixture(Order* left, Order* right) {
      // perturb left using right. this is useful since
      // we don't care about absolute locations, relative ones matter more,
      // and a true merge of two vectors could obscure that (e.g.
      // a.......... and ..........a would merge a into the middle, for no
      // reason), and cause a lot of unnecessary noise
      Index size = left->size();
      Order reverseRight; // reverseRight[x] is the index of x in right
      reverseRight.resize(size);
      for (Index i = 0; i < size; i++) {
        reverseRight[(*right)[i]] = i;
      }
      auto* ret = new Order;
      *ret = *left;
      assert(size >= 1);
      for (Index i = parent->getFunction()->getNumParams(); i < size - 1; i++) {
        // if (i, i + 1) is in reverse order in right, flip them
        if (reverseRight[(*ret)[i]] > reverseRight[(*ret)[i + 1]]) {
          std::swap((*ret)[i], (*ret)[i + 1]);
          // if we don't skip, we might end up pushing an element all the way to
          // the end, which is not very perturbation-y
          i++;
        }
      }
      calculateFitness(ret);
#ifdef CFG_LEARN_DEBUG
      ret->dump("new mixture");
#endif
      return ret;
    }

  private:
    CoalesceLocalsWithLearning* parent;
    std::mt19937 noise;
    bool first = true;
  };

#ifdef CFG_LEARN_DEBUG
  std::cout << "[learning for " << getFunction()->name << "]\n";
#endif
  auto numVars = this->getFunction()->getNumVars();
  const int GENERATION_SIZE =
    std::min(Index(numVars * (numVars - 1)), Index(20));
  Generator generator(this);
  GeneticLearner<Order, double, Generator> learner(generator, GENERATION_SIZE);
#ifdef CFG_LEARN_DEBUG
  learner.getBest()->dump("first best");
#endif
  // keep working while we see improvement
  auto oldBest = learner.getBest()->getFitness();
  while (1) {
    learner.runGeneration();
    auto newBest = learner.getBest()->getFitness();
    if (newBest == oldBest) {
      break; // unlikely we can improve
    }
    oldBest = newBest;
#ifdef CFG_LEARN_DEBUG
    learner.getBest()->dump("current best");
#endif
  }
#ifdef CFG_LEARN_DEBUG
  learner.getBest()->dump("the best");
#endif
  // TODO: cache indices in Orders, at the cost of more memory?
  this->pickIndicesFromOrder(*learner.getBest(), indices);
}